

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall
arma::Mat<double>::
Mat<arma::eOp<arma::Col<double>,arma::eop_neg>,arma::eOp<arma::Col<double>,arma::eop_square>,arma::eglue_div>
          (Mat<double> *this,
          eGlue<arma::eOp<arma::Col<double>,_arma::eop_neg>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
          *X)

{
  Mat<double> *in_RSI;
  Mat<double> *in_RDI;
  
  in_RDI->n_rows = *(uword *)**(undefined8 **)in_RSI;
  in_RDI->n_cols = 1;
  in_RDI->n_elem = *(uword *)(**(long **)in_RSI + 8);
  in_RDI->n_alloc = 0;
  in_RDI->vec_state = 0;
  in_RDI->mem_state = 0;
  in_RDI->mem = (double *)0x0;
  init_cold(in_RSI);
  eglue_core<arma::eglue_div>::
  apply<arma::Mat<double>,arma::eOp<arma::Col<double>,arma::eop_neg>,arma::eOp<arma::Col<double>,arma::eop_square>>
            (in_RDI,(eGlue<arma::eOp<arma::Col<double>,_arma::eop_neg>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
                     *)in_RSI);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eGlue<T1, T2, eglue_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  arma_type_check(( is_same_type< eT, typename T2::elem_type >::no ));
  
  init_cold();
  
  eglue_type::apply(*this, X);
  }